

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::reallocate
          (QMovableArrayOps<QByteArray> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QByteArray>_*,_QByteArray_*> pVar1;
  
  pVar1 = QTypedArrayData<QByteArray>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                     d,(this->super_QGenericArrayOps<QByteArray>).
                       super_QArrayDataPointer<QByteArray>.ptr,alloc,option);
  (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.d = pVar1.first;
  (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }